

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

PathFindingOnMapCase * __thiscall
testing::internal::ValuesInIteratorRangeGenerator<graph_tests::PathFindingOnMapCase>::Iterator::
Current(Iterator *this)

{
  PathFindingOnMapCase *__x;
  pointer __p;
  
  if ((this->value_)._M_t.
      super___uniq_ptr_impl<const_graph_tests::PathFindingOnMapCase,_std::default_delete<const_graph_tests::PathFindingOnMapCase>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_graph_tests::PathFindingOnMapCase_*,_std::default_delete<const_graph_tests::PathFindingOnMapCase>_>
      .super__Head_base<0UL,_const_graph_tests::PathFindingOnMapCase_*,_false>._M_head_impl ==
      (PathFindingOnMapCase *)0x0) {
    __p = (pointer)operator_new(0x20);
    __x = (this->iterator_)._M_current;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__p,&__x->map);
    __p->shortest_length = __x->shortest_length;
    std::
    __uniq_ptr_impl<const_graph_tests::PathFindingOnMapCase,_std::default_delete<const_graph_tests::PathFindingOnMapCase>_>
    ::reset((__uniq_ptr_impl<const_graph_tests::PathFindingOnMapCase,_std::default_delete<const_graph_tests::PathFindingOnMapCase>_>
             *)&this->value_,__p);
  }
  return (this->value_)._M_t.
         super___uniq_ptr_impl<const_graph_tests::PathFindingOnMapCase,_std::default_delete<const_graph_tests::PathFindingOnMapCase>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_graph_tests::PathFindingOnMapCase_*,_std::default_delete<const_graph_tests::PathFindingOnMapCase>_>
         .super__Head_base<0UL,_const_graph_tests::PathFindingOnMapCase_*,_false>._M_head_impl;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }